

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSemantic.cpp
# Opt level: O2

void __thiscall UnitTest_semantic15::Run(UnitTest_semantic15 *this)

{
  Terminator *pTVar1;
  allocator local_59;
  _Head_base<0UL,_luna::SyntaxTree_*,_false> local_58;
  string local_50;
  allocator local_30 [32];
  
  std::__cxx11::string::string((string *)&local_50,"for i = 1, 10 do print(i) end",local_30);
  anon_unknown.dwarf_16d51::Semantic((anon_unknown_dwarf_16d51 *)&local_58,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)local_30,"i",&local_59);
  std::__cxx11::string::string((string *)&local_50,(string *)local_30);
  pTVar1 = ASTFind<luna::Terminator,FindName>
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      &local_58,(FindName *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)local_30);
  if (pTVar1->scoping_ != LexicalScoping_Local) {
    std::__cxx11::string::string
              ((string *)&local_50,"\'i->scoping_ == luna::LexicalScoping_Local\'",local_30);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if (local_58._M_head_impl != (SyntaxTree *)0x0) {
    (*(local_58._M_head_impl)->_vptr_SyntaxTree[1])();
  }
  return;
}

Assistant:

TEST_CASE(semantic15)
{
    auto ast = Semantic("for i = 1, 10 do print(i) end");
    auto i = ASTFind<luna::Terminator>(ast, FindName("i"));
    EXPECT_TRUE(i->scoping_ == luna::LexicalScoping_Local);
}